

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cfd_js_api_json_autogen.h
# Opt level: O0

void __thiscall
cfd::js::api::json::ElementsDecodeRawTransactionRequest::ElementsDecodeRawTransactionRequest
          (ElementsDecodeRawTransactionRequest *this)

{
  allocator local_26;
  allocator local_25 [20];
  allocator local_11;
  ElementsDecodeRawTransactionRequest *local_10;
  ElementsDecodeRawTransactionRequest *this_local;
  
  local_10 = this;
  core::JsonClassBase<cfd::js::api::json::ElementsDecodeRawTransactionRequest>::JsonClassBase
            (&this->super_JsonClassBase<cfd::js::api::json::ElementsDecodeRawTransactionRequest>);
  (this->super_JsonClassBase<cfd::js::api::json::ElementsDecodeRawTransactionRequest>).
  _vptr_JsonClassBase = (_func_int **)&PTR__ElementsDecodeRawTransactionRequest_01b4c170;
  std::
  set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::set(&this->ignore_items);
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)&this->hex_,"",&local_11);
  std::allocator<char>::~allocator((allocator<char> *)&local_11);
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)&this->network_,"liquidv1",local_25);
  std::allocator<char>::~allocator((allocator<char> *)local_25);
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)&this->mainchain_network_,"",&local_26);
  std::allocator<char>::~allocator((allocator<char> *)&local_26);
  this->iswitness_ = true;
  this->full_dump_ = false;
  CollectFieldName();
  return;
}

Assistant:

ElementsDecodeRawTransactionRequest() {
    CollectFieldName();
  }